

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::LoadEnvironmentPresets(cmake *this)

{
  bool bVar1;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  anon_class_16_2_d2341f1b readGeneratorVar;
  bool local_31;
  undefined1 local_30 [7];
  bool hasEnvironmentGenerator;
  string envGenVar;
  cmake *this_local;
  
  envGenVar.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  local_31 = false;
  bVar1 = cmsys::SystemTools::GetEnv("CMAKE_GENERATOR",(string *)local_30);
  if (bVar1) {
    local_31 = true;
    std::__cxx11::string::operator=((string *)&this->EnvironmentGenerator,(string *)local_30);
  }
  local_58 = (undefined1  [8])&local_31;
  readGeneratorVar.hasEnvironmentGenerator = (bool *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_GENERATOR_INSTANCE",&local_79);
  LoadEnvironmentPresets::anon_class_16_2_d2341f1b::operator()
            ((anon_class_16_2_d2341f1b *)local_58,&local_78,&this->GeneratorInstance);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CMAKE_GENERATOR_PLATFORM",&local_a1);
  LoadEnvironmentPresets::anon_class_16_2_d2341f1b::operator()
            ((anon_class_16_2_d2341f1b *)local_58,&local_a0,&this->GeneratorPlatform);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_GENERATOR_TOOLSET",&local_c9);
  LoadEnvironmentPresets::anon_class_16_2_d2341f1b::operator()
            ((anon_class_16_2_d2341f1b *)local_58,&local_c8,&this->GeneratorToolset);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmake::LoadEnvironmentPresets()
{
  std::string envGenVar;
  bool hasEnvironmentGenerator = false;
  if (cmSystemTools::GetEnv("CMAKE_GENERATOR", envGenVar)) {
    hasEnvironmentGenerator = true;
    this->EnvironmentGenerator = envGenVar;
  }

  auto readGeneratorVar = [&](std::string name, std::string& key) {
    std::string varValue;
    if (cmSystemTools::GetEnv(name, varValue)) {
      if (hasEnvironmentGenerator) {
        key = varValue;
      } else if (!this->GetIsInTryCompile()) {
        std::string message = "Warning: Environment variable ";
        message += name;
        message += " will be ignored, because CMAKE_GENERATOR ";
        message += "is not set.";
        cmSystemTools::Message(message, "Warning");
      }
    }
  };

  readGeneratorVar("CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance);
  readGeneratorVar("CMAKE_GENERATOR_PLATFORM", this->GeneratorPlatform);
  readGeneratorVar("CMAKE_GENERATOR_TOOLSET", this->GeneratorToolset);
}